

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::MockCodeGenerator::MockCodeGenerator
          (MockCodeGenerator *this,string_view name)

{
  allocator<const_google::protobuf::FieldDescriptor_*> *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l_00;
  bool bVar1;
  Edition EVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_130;
  size_t local_120;
  char *local_118;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_110;
  size_t local_100;
  char *local_f8;
  initializer_list<const_google::protobuf::FieldDescriptor_*> local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e0;
  size_t local_d0;
  char *local_c8;
  FieldDescriptor *local_c0;
  iterator local_b8;
  undefined8 local_b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  size_t local_98;
  char *local_90;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  string_view key;
  FieldDescriptor *local_50;
  iterator local_48;
  size_type local_40;
  allocator<char> local_21;
  MockCodeGenerator *local_20;
  MockCodeGenerator *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (MockCodeGenerator *)name._M_len;
  local_20 = this;
  CodeGenerator::CodeGenerator(&this->super_CodeGenerator);
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__MockCodeGenerator_02a2a4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name_,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_21);
  std::allocator<char>::~allocator(&local_21);
  this->suppressed_features_ = 0;
  EVar2 = ProtocMinimumEdition();
  this->minimum_edition_ = EVar2;
  EVar2 = ProtocMaximumEdition();
  this->maximum_edition_ = EVar2;
  local_50 = GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                       ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                         *)pb::test);
  local_48 = &local_50;
  local_40 = 1;
  this_00 = (allocator<const_google::protobuf::FieldDescriptor_*> *)((long)&key._M_str + 7);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(this_00);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&this->feature_extensions_,__l_00,this_00);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator
            ((allocator<const_google::protobuf::FieldDescriptor_*> *)((long)&key._M_str + 7));
  local_78 = compiler::anon_unknown_0::GetTestCase();
  key._M_len = (size_t)local_78._M_str;
  local_68 = local_78._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"no_editions");
  bVar1 = std::operator==(local_78,local_88);
  if (bVar1) {
    this->suppressed_features_ = this->suppressed_features_ | 2;
  }
  else {
    local_98 = local_68;
    local_90 = (char *)key._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a8,"invalid_features");
    __x_02._M_str = local_90;
    __x_02._M_len = local_98;
    bVar1 = std::operator==(__x_02,local_a8);
    if (bVar1) {
      local_c0 = (FieldDescriptor *)0x0;
      local_b8 = &local_c0;
      local_b0 = 1;
      __l._M_len = 1;
      __l._M_array = local_b8;
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::operator=(&this->feature_extensions_,__l);
    }
    else {
      local_d0 = local_68;
      local_c8 = (char *)key._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e0,"no_feature_defaults");
      __x_01._M_str = local_c8;
      __x_01._M_len = local_d0;
      bVar1 = std::operator==(__x_01,local_e0);
      if (bVar1) {
        std::initializer_list<const_google::protobuf::FieldDescriptor_*>::initializer_list
                  (&local_f0);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::operator=(&this->feature_extensions_,local_f0);
      }
      else {
        local_100 = local_68;
        local_f8 = (char *)key._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_110,"high_maximum");
        __x_00._M_str = local_f8;
        __x_00._M_len = local_100;
        bVar1 = std::operator==(__x_00,local_110);
        if (bVar1) {
          this->maximum_edition_ = EDITION_99997_TEST_ONLY;
        }
        else {
          local_120 = local_68;
          local_118 = (char *)key._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_130,"low_minimum");
          __x._M_str = local_118;
          __x._M_len = local_120;
          bVar1 = std::operator==(__x,local_130);
          if (bVar1) {
            this->maximum_edition_ = EDITION_1_TEST_ONLY;
          }
        }
      }
    }
  }
  return;
}

Assistant:

MockCodeGenerator::MockCodeGenerator(absl::string_view name) : name_(name) {
  absl::string_view key = GetTestCase();
  if (key == "no_editions") {
    suppressed_features_ |= CodeGenerator::FEATURE_SUPPORTS_EDITIONS;
  } else if (key == "invalid_features") {
    feature_extensions_ = {nullptr};
  } else if (key == "no_feature_defaults") {
    feature_extensions_ = {};
  } else if (key == "high_maximum") {
    maximum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (key == "low_minimum") {
    maximum_edition_ = Edition::EDITION_1_TEST_ONLY;
  }
}